

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void el::base::utils::File::buildBaseFilename
               (string *fullPath,char *buff,size_t limit,char *separator)

{
  pointer pcVar1;
  long lVar2;
  size_t sVar3;
  char *__s;
  char *__src;
  long lVar4;
  
  pcVar1 = (fullPath->_M_dataplus)._M_p;
  strlen(separator);
  lVar2 = ::std::__cxx11::string::find_last_of((char *)fullPath,(ulong)separator,0xffffffffffffffff)
  ;
  lVar4 = lVar2 + 1;
  if (lVar2 == 0) {
    lVar4 = 0;
  }
  __s = pcVar1 + lVar4;
  sVar3 = strlen(__s);
  __src = __s;
  if (((limit <= sVar3) && (__src = __s + (sVar3 - limit), __s[sVar3 - limit] != '.')) &&
     (__src[1] != '.')) {
    __src = __src + 3;
    sVar3 = strlen(buff);
    (buff + sVar3)[0] = '.';
    (buff + sVar3)[1] = '.';
    buff[sVar3 + 2] = '\0';
  }
  strcat(buff,__src);
  return;
}

Assistant:

void File::buildBaseFilename(const std::string& fullPath, char buff[], std::size_t limit, const char* separator) {
  const char *filename = fullPath.c_str();
  std::size_t lastSlashAt = fullPath.find_last_of(separator);
  filename += lastSlashAt ? lastSlashAt+1 : 0;
  std::size_t sizeOfFilename = strlen(filename);
  if (sizeOfFilename >= limit) {
    filename += (sizeOfFilename - limit);
    if (filename[0] != '.' && filename[1] != '.') {  // prepend if not already
      filename += 3;  // 3 = '..'
      STRCAT(buff, "..", limit);
    }
  }
  STRCAT(buff, filename, limit);
}